

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::RenderText(ImVec2 pos,char *text,char *text_end,bool hide_text_after_hash)

{
  float font_size;
  ImDrawList *this;
  ImFont *font;
  ImGuiContext *pIVar1;
  ImU32 col;
  ImGuiWindow *pIVar2;
  size_t sVar3;
  char *pcStack_40;
  int text_len;
  char *text_display_end;
  ImGuiWindow *window;
  ImGuiContext *g;
  char *pcStack_20;
  bool hide_text_after_hash_local;
  char *text_end_local;
  char *text_local;
  ImVec2 pos_local;
  
  pIVar1 = GImGui;
  text_local = (char *)pos;
  pIVar2 = GetCurrentWindow();
  if (hide_text_after_hash) {
    pcStack_40 = FindRenderedTextEnd(text,text_end);
  }
  else {
    pcStack_20 = text_end;
    if (text_end == (char *)0x0) {
      sVar3 = strlen(text);
      pcStack_20 = text + sVar3;
    }
    pcStack_40 = pcStack_20;
  }
  if (0 < (int)pcStack_40 - (int)text) {
    this = pIVar2->DrawList;
    font = pIVar1->Font;
    font_size = pIVar1->FontSize;
    col = GetColorU32(0,1.0);
    ImDrawList::AddText(this,font,font_size,(ImVec2 *)&text_local,col,text,pcStack_40,0.0,
                        (ImVec4 *)0x0);
    if ((pIVar1->LogEnabled & 1U) != 0) {
      LogRenderedText((ImVec2 *)&text_local,text,pcStack_40);
    }
  }
  return;
}

Assistant:

void ImGui::RenderText(ImVec2 pos, const char* text, const char* text_end, bool hide_text_after_hash)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    // Hide anything after a '##' string
    const char* text_display_end;
    if (hide_text_after_hash)
    {
        text_display_end = FindRenderedTextEnd(text, text_end);
    }
    else
    {
        if (!text_end)
            text_end = text + strlen(text); // FIXME-OPT
        text_display_end = text_end;
    }

    const int text_len = (int)(text_display_end - text);
    if (text_len > 0)
    {
        window->DrawList->AddText(g.Font, g.FontSize, pos, GetColorU32(ImGuiCol_Text), text, text_display_end);
        if (g.LogEnabled)
            LogRenderedText(pos, text, text_display_end);
    }
}